

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O0

aspa_status aspa_array_reallocate(aspa_array *array)

{
  long lVar1;
  aspa_record *paVar2;
  long in_FS_OFFSET;
  aspa_record *tmp;
  size_t SIZE_INCREASE_OFFSET;
  aspa_array *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  paVar2 = (aspa_record *)lrtr_realloc(array->data,array->capacity * 0x18 + 1000);
  if (paVar2 == (aspa_record *)0x0) {
    array_local._4_4_ = ASPA_ERROR;
  }
  else {
    array->data = paVar2;
    array->capacity = array->capacity + 1000;
    array_local._4_4_ = ASPA_SUCCESS;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return array_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static enum aspa_status aspa_array_reallocate(struct aspa_array *array)
{
	// the factor by how much the capacity will increase: new_capacity = old_capacity + SIZE_INCREASE_OFFSET
	const size_t SIZE_INCREASE_OFFSET = 1000;

	// allocation the new chunk of memory
	struct aspa_record *tmp =
		lrtr_realloc(array->data, sizeof(struct aspa_record) * array->capacity + SIZE_INCREASE_OFFSET);

	// malloc failed so returning an error
	if (!tmp)
		return ASPA_ERROR;

	array->data = tmp;
	array->capacity += SIZE_INCREASE_OFFSET;
	return ASPA_SUCCESS;
}